

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void * luaL_testudata(lua_State *L,int idx,char *tname)

{
  ulong uVar1;
  ulong uVar2;
  TValue *pTVar3;
  size_t lenx;
  GCstr *key;
  cTValue *pcVar4;
  cTValue *tv;
  GCudata *ud;
  cTValue *o;
  char *tname_local;
  int idx_local;
  lua_State *L_local;
  
  pTVar3 = index2adr(L,idx);
  if ((int)(pTVar3->field_4).it >> 0xf == -0xd) {
    uVar1 = pTVar3->u64;
    uVar2 = *(ulong *)((L->glref).ptr64 + 0x110);
    lenx = strlen(tname);
    key = lj_str_new(L,tname,lenx);
    pcVar4 = lj_tab_getstr((GCtab *)(uVar2 & 0x7fffffffffff),key);
    if (((pcVar4 != (cTValue *)0x0) && ((int)(pcVar4->field_4).it >> 0xf == -0xc)) &&
       ((pcVar4->u64 & 0x7fffffffffff) == *(ulong *)((uVar1 & 0x7fffffffffff) + 0x20))) {
      return (void *)((uVar1 & 0x7fffffffffff) + 0x30);
    }
  }
  return (void *)0x0;
}

Assistant:

LUALIB_API void *luaL_testudata(lua_State *L, int idx, const char *tname)
{
  cTValue *o = index2adr(L, idx);
  if (tvisudata(o)) {
    GCudata *ud = udataV(o);
    cTValue *tv = lj_tab_getstr(tabV(registry(L)), lj_str_newz(L, tname));
    if (tv && tvistab(tv) && tabV(tv) == tabref(ud->metatable))
      return uddata(ud);
  }
  return NULL;  /* value is not a userdata with a metatable */
}